

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint *puVar4;
  
  uVar3 = insn >> 0x16 & 3;
  uVar1 = MCInst_getOpcode(Inst);
  puVar4 = GPR64DecoderTable;
  DVar2 = MCDisassembler_Fail;
  if (0x122 < (int)uVar1) {
    if (0x488 < (int)uVar1) {
      if ((int)uVar1 < 0x7a3) {
        if (uVar1 == 0x489) goto switchD_001ef9bf_caseD_6b;
        if (uVar1 == 0x48c) goto switchD_001ef9bf_caseD_6d;
        if (uVar1 != 0x79f) {
          return MCDisassembler_Fail;
        }
      }
      else {
        if ((uVar1 == 0x7a3) || (uVar1 == 0x7ac)) goto LAB_001efa2b;
        if (uVar1 != 0x7a8) {
          return MCDisassembler_Fail;
        }
      }
      goto LAB_001ef9dd;
    }
    switch(uVar1) {
    case 0x123:
    case 0x128:
      goto switchD_001ef9bf_caseD_6b;
    case 0x124:
    case 0x126:
    case 0x127:
    case 0x129:
    case 0x12a:
      goto switchD_001ef9bf_caseD_6c;
    case 0x125:
    case 299:
      break;
    default:
      if (uVar1 == 0x482) goto switchD_001ef9bf_caseD_6b;
      if (uVar1 != 0x484) {
        return MCDisassembler_Fail;
      }
    }
    goto switchD_001ef9bf_caseD_6d;
  }
  if ((int)uVar1 < 0x44) {
    if (uVar1 != 0x32) {
      if (uVar1 == 0x36) goto LAB_001efa2b;
      if (uVar1 != 0x40) {
        return MCDisassembler_Fail;
      }
    }
LAB_001ef9dd:
    if ((short)insn < 0 || uVar3 == 3) {
      return MCDisassembler_Fail;
    }
LAB_001efa1d:
    puVar4 = GPR32DecoderTable;
  }
  else {
    switch(uVar1) {
    case 0x59:
    case 0x5f:
switchD_001ef9bf_caseD_6b:
      if ((short)insn < 0) {
        return MCDisassembler_Fail;
      }
      goto LAB_001efa1d;
    case 0x5a:
    case 0x5b:
    case 0x5d:
    case 0x5e:
    case 0x60:
    case 0x61:
      goto switchD_001ef9bf_caseD_6c;
    case 0x5c:
    case 0x62:
      break;
    default:
      switch(uVar1) {
      case 0x6b:
      case 0x6f:
        goto switchD_001ef9bf_caseD_6b;
      case 0x6c:
      case 0x6e:
      case 0x70:
        goto switchD_001ef9bf_caseD_6c;
      case 0x6d:
      case 0x71:
        break;
      default:
        if (uVar1 != 0x44) {
          return MCDisassembler_Fail;
        }
LAB_001efa2b:
        if (uVar3 == 3) {
          return MCDisassembler_Fail;
        }
      }
    }
  }
switchD_001ef9bf_caseD_6d:
  MCOperand_CreateReg0(Inst,puVar4[insn & 0x1f]);
  MCOperand_CreateReg0(Inst,puVar4[insn >> 5 & 0x1f]);
  MCOperand_CreateReg0(Inst,puVar4[insn >> 0x10 & 0x1f]);
  MCOperand_CreateImm0(Inst,(ulong)(uVar3 << 6 | insn >> 10 & 0x3f));
  DVar2 = MCDisassembler_Success;
switchD_001ef9bf_caseD_6c:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rm = fieldFromInstruction(insn, 16, 5);
	unsigned shiftHi = fieldFromInstruction(insn, 22, 2);
	unsigned shiftLo = fieldFromInstruction(insn, 10, 6);
	unsigned shift = (shiftHi << 6) | shiftLo;

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_ADDWrs:
		case AArch64_ADDSWrs:
		case AArch64_SUBWrs:
		case AArch64_SUBSWrs:
			// if shift == '11' then ReservedValue()
			if (shiftHi == 0x3)
				return Fail;
			// Deliberate fallthrough
		case AArch64_ANDWrs:
		case AArch64_ANDSWrs:
		case AArch64_BICWrs:
		case AArch64_BICSWrs:
		case AArch64_ORRWrs:
		case AArch64_ORNWrs:
		case AArch64_EORWrs:
		case AArch64_EONWrs: {
				// if sf == '0' and imm6<5> == '1' then ReservedValue()
				if (shiftLo >> 5 == 1)
					return Fail;
				DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
				break;
			}
		case AArch64_ADDXrs:
		case AArch64_ADDSXrs:
		case AArch64_SUBXrs:
		case AArch64_SUBSXrs:
				 // if shift == '11' then ReservedValue()
				 if (shiftHi == 0x3)
					 return Fail;
				 // Deliberate fallthrough
		case AArch64_ANDXrs:
		case AArch64_ANDSXrs:
		case AArch64_BICXrs:
		case AArch64_BICSXrs:
		case AArch64_ORRXrs:
		case AArch64_ORNXrs:
		case AArch64_EORXrs:
		case AArch64_EONXrs:
				 DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
				 break;
	}

	MCOperand_CreateImm0(Inst, shift);
	return Success;
}